

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void ggml_vec_scale_f32(int n,float *y,float v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [64];
  long lVar9;
  long in_RSI;
  uint in_EDI;
  undefined1 auVar10 [64];
  float in_XMM0_Da;
  int i_1;
  int j;
  int i;
  __m512 ay [4];
  __m512 vx;
  int np;
  uint local_34c;
  int local_348;
  int local_344;
  undefined8 local_340 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  uint local_1d8;
  float local_1d4;
  long local_1d0;
  uint local_1c4;
  undefined1 local_1c0 [64];
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 *local_58;
  
  local_1d8 = in_EDI & 0xffffffc0;
  local_1c0 = vbroadcastss_avx512f(ZEXT416((uint)in_XMM0_Da));
  local_240 = local_1c0._0_8_;
  uStack_238 = local_1c0._8_8_;
  uStack_230 = local_1c0._16_8_;
  uStack_228 = local_1c0._24_8_;
  uStack_220 = local_1c0._32_8_;
  uStack_218 = local_1c0._40_8_;
  uStack_210 = local_1c0._48_8_;
  uStack_208 = local_1c0._56_8_;
  local_1d4 = in_XMM0_Da;
  local_1d0 = in_RSI;
  local_1c4 = in_EDI;
  for (local_344 = 0; local_344 < (int)local_1d8; local_344 = local_344 + 0x40) {
    for (local_348 = 0; local_348 < 4; local_348 = local_348 + 1) {
      local_148 = (undefined8 *)(local_1d0 + (long)local_344 * 4 + (long)(local_348 << 4) * 4);
      uVar1 = local_148[1];
      uVar2 = local_148[2];
      uVar3 = local_148[3];
      uVar4 = local_148[4];
      uVar5 = local_148[5];
      uVar6 = local_148[6];
      uVar7 = local_148[7];
      lVar9 = (long)local_348;
      local_340[lVar9 * 8] = *local_148;
      local_340[lVar9 * 8 + 1] = uVar1;
      local_340[lVar9 * 8 + 2] = uVar2;
      local_340[lVar9 * 8 + 3] = uVar3;
      local_340[lVar9 * 8 + 4] = uVar4;
      local_340[lVar9 * 8 + 5] = uVar5;
      local_340[lVar9 * 8 + 6] = uVar6;
      local_340[lVar9 * 8 + 7] = uVar7;
      lVar9 = (long)local_348;
      local_100 = local_340[lVar9 * 8];
      uStack_f8 = local_340[lVar9 * 8 + 1];
      uStack_f0 = local_340[lVar9 * 8 + 2];
      uStack_e8 = local_340[lVar9 * 8 + 3];
      uStack_e0 = local_340[lVar9 * 8 + 4];
      uStack_d8 = local_340[lVar9 * 8 + 5];
      uStack_d0 = local_340[lVar9 * 8 + 6];
      uStack_c8 = local_340[lVar9 * 8 + 7];
      local_140 = local_240;
      uStack_138 = uStack_238;
      uStack_130 = uStack_230;
      uStack_128 = uStack_228;
      uStack_120 = uStack_220;
      uStack_118 = uStack_218;
      uStack_110 = uStack_210;
      uStack_108 = uStack_208;
      auVar8._8_8_ = local_340[lVar9 * 8 + 1];
      auVar8._0_8_ = local_340[lVar9 * 8];
      auVar8._16_8_ = local_340[lVar9 * 8 + 2];
      auVar8._24_8_ = local_340[lVar9 * 8 + 3];
      auVar8._32_8_ = local_340[lVar9 * 8 + 4];
      auVar8._40_8_ = local_340[lVar9 * 8 + 5];
      auVar8._48_8_ = local_340[lVar9 * 8 + 6];
      auVar8._56_8_ = local_340[lVar9 * 8 + 7];
      auVar10._8_8_ = uStack_238;
      auVar10._0_8_ = local_240;
      auVar10._16_8_ = uStack_230;
      auVar10._24_8_ = uStack_228;
      auVar10._32_8_ = uStack_220;
      auVar10._40_8_ = uStack_218;
      auVar10._48_8_ = uStack_210;
      auVar10._56_8_ = uStack_208;
      auVar10 = vmulps_avx512f(auVar8,auVar10);
      *(undefined1 (*) [64])(local_340 + (long)local_348 * 8) = auVar10;
      local_58 = (undefined8 *)(local_1d0 + (long)local_344 * 4 + (long)(local_348 << 4) * 4);
      lVar9 = (long)local_348;
      uStack_b8 = local_340[lVar9 * 8 + 1];
      uStack_b0 = local_340[lVar9 * 8 + 2];
      uStack_a8 = local_340[lVar9 * 8 + 3];
      uStack_a0 = local_340[lVar9 * 8 + 4];
      uStack_98 = local_340[lVar9 * 8 + 5];
      uStack_90 = local_340[lVar9 * 8 + 6];
      uStack_88 = local_340[lVar9 * 8 + 7];
      local_c0 = local_340[lVar9 * 8];
      *local_58 = local_340[lVar9 * 8];
      local_58[1] = uStack_b8;
      local_58[2] = uStack_b0;
      local_58[3] = uStack_a8;
      local_58[4] = uStack_a0;
      local_58[5] = uStack_98;
      local_58[6] = uStack_90;
      local_58[7] = uStack_88;
    }
  }
  for (local_34c = local_1d8; (int)local_34c < (int)local_1c4; local_34c = local_34c + 1) {
    *(float *)(local_1d0 + (long)(int)local_34c * 4) =
         local_1d4 * *(float *)(local_1d0 + (long)(int)local_34c * 4);
  }
  return;
}

Assistant:

inline static void ggml_vec_scale_f32(const int n, float * y, const float   v) {
#if defined(GGML_USE_ACCELERATE)
    vDSP_vsmul(y, 1, &v, y, 1, n);
#elif defined(GGML_SIMD)
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC vx = GGML_F32_VEC_SET1(v);

    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_MUL(ay[j], vx);

            GGML_F32_VEC_STORE(y + i + j*GGML_F32_EPR, ay[j]);
        }
    }

    // leftovers
    for (int i = np; i < n; ++i) {
        y[i] *= v;
    }
#else
    // scalar
    for (int i = 0; i < n; ++i) {
        y[i] *= v;
    }
#endif
}